

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O0

void WebRate(sunrealtype xx,sunrealtype yy,sunrealtype *cxy,sunrealtype *ratesxy,void *user_data)

{
  long in_RDX;
  long in_RSI;
  sunrealtype *in_RDI;
  double in_XMM0_Qa;
  sunrealtype sVar1;
  double in_XMM1_Qa;
  UserData data;
  sunrealtype fac;
  sunindextype i;
  long local_30;
  
  for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
    sVar1 = DotProd(6,in_RDI,*(sunrealtype **)(*(long *)(in_RDX + 0x400) + local_30 * 8));
    *(sunrealtype *)(in_RSI + local_30 * 8) = sVar1;
  }
  for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
    *(double *)(in_RSI + local_30 * 8) =
         in_RDI[local_30] *
         (*(double *)(*(long *)(in_RDX + 0x408) + local_30 * 8) *
          (in_XMM0_Qa * 1.0 * in_XMM1_Qa + 1.0) + *(double *)(in_RSI + local_30 * 8));
  }
  return;
}

Assistant:

static void WebRate(sunrealtype xx, sunrealtype yy, sunrealtype* cxy,
                    sunrealtype* ratesxy, void* user_data)
{
  sunindextype i;
  sunrealtype fac;
  UserData data;

  data = (UserData)user_data;

  for (i = 0; i < NUM_SPECIES; i++)
  {
    ratesxy[i] = DotProd(NUM_SPECIES, cxy, acoef[i]);
  }

  fac = ONE + ALPHA * xx * yy;

  for (i = 0; i < NUM_SPECIES; i++)
  {
    ratesxy[i] = cxy[i] * (bcoef[i] * fac + ratesxy[i]);
  }
}